

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnVector<int>::ColumnVector
          (ColumnVector<int> *this,vector<int,_std::allocator<int>_> *data)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  TypeRef *type;
  Column *in_stack_ffffffffffffffd0;
  TypeRef local_20 [2];
  
  type = local_20;
  Type::CreateSimple<int>();
  Column::Column(in_stack_ffffffffffffffd0,type);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x2140d2);
  *in_RDI = &PTR__ColumnVector_002a0398;
  std::vector<int,_std::allocator<int>_>::vector(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector(const std::vector<T>& data)
    : Column(Type::CreateSimple<T>())
    , data_(data)
{
}